

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

void point_add(u8 *r,u8 *p,u8 *q)

{
  int iVar1;
  u8 *a;
  u8 *b;
  u8 *d;
  u8 *ry;
  u8 *rx;
  u8 *qy;
  u8 *qx;
  u8 *py;
  u8 *px;
  u8 u [30];
  u8 t [30];
  u8 s [30];
  u8 *q_local;
  u8 *p_local;
  u8 *r_local;
  
  a = p + 0x1e;
  b = q + 0x1e;
  d = r + 0x1e;
  iVar1 = point_is_zero(p);
  if (iVar1 == 0) {
    iVar1 = point_is_zero(q);
    if (iVar1 == 0) {
      elt_add((u8 *)&px,p,q);
      iVar1 = elt_is_zero((u8 *)&px);
      if (iVar1 == 0) {
        elt_inv(u + 0x18,(u8 *)&px);
        elt_add((u8 *)&px,a,b);
        elt_mul(t + 0x18,u + 0x18,(u8 *)&px);
        elt_square(u + 0x18,t + 0x18);
        elt_add(u + 0x18,u + 0x18,t + 0x18);
        elt_add(u + 0x18,u + 0x18,q);
        t[0x15] = t[0x15] ^ 1;
        elt_mul((u8 *)&px,t + 0x18,u + 0x18);
        elt_add(t + 0x18,(u8 *)&px,a);
        elt_add(r,u + 0x18,p);
        elt_add(d,t + 0x18,r);
      }
      else {
        elt_add((u8 *)&px,a,b);
        iVar1 = elt_is_zero((u8 *)&px);
        if (iVar1 == 0) {
          elt_zero(r);
          elt_zero(d);
        }
        else {
          point_double(r,p);
        }
      }
    }
    else {
      elt_copy(r,p);
      elt_copy(d,a);
    }
  }
  else {
    elt_copy(r,q);
    elt_copy(d,b);
  }
  return;
}

Assistant:

static void point_add(u8 *r, u8 *p, u8 *q)
{
	u8 s[30], t[30], u[30];
	u8 *px, *py, *qx, *qy, *rx, *ry;

	px = p;
	py = p + 30;
	qx = q;
	qy = q + 30;
	rx = r;
	ry = r + 30;

	if (point_is_zero(p)) {
		elt_copy(rx, qx);
		elt_copy(ry, qy);
		return;
	}

	if (point_is_zero(q)) {
		elt_copy(rx, px);
		elt_copy(ry, py);
		return;
	}

	elt_add(u, px, qx);

	if (elt_is_zero(u)) {
		elt_add(u, py, qy);
		if (elt_is_zero(u))
			point_double(r, p);
		else {
			elt_zero(rx);
			elt_zero(ry);
		}

		return;
	}

	elt_inv(t, u);
	elt_add(u, py, qy);
	elt_mul(s, t, u);

	elt_square(t, s);
	elt_add(t, t, s);
	elt_add(t, t, qx);
	t[29] ^= 1;

	elt_mul(u, s, t);
	elt_add(s, u, py);
	elt_add(rx, t, px);
	elt_add(ry, s, rx);
}